

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivUpdatePointers(Gia_Man_t *p,Gia_Man_t *pNew)

{
  int v;
  Gia_Obj_t *pGVar1;
  bool bVar2;
  int local_2c;
  int i;
  Gia_Obj_t *pObjNew;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew_local;
  Gia_Man_t *p_local;
  
  local_2c = 0;
  while( true ) {
    bVar2 = false;
    if (local_2c < p->nObjs) {
      pObjNew = Gia_ManObj(p,local_2c);
      bVar2 = pObjNew != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    if (pObjNew->Value != 0xffffffff) {
      v = Abc_Lit2Var(pObjNew->Value);
      pGVar1 = Gia_ManObj(pNew,v);
      if ((*(ulong *)pGVar1 >> 0x1e & 1) != 0) {
        pObjNew->Value = 0xffffffff;
      }
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Gia_ManEquivUpdatePointers( Gia_Man_t * p, Gia_Man_t * pNew )
{
    Gia_Obj_t * pObj, * pObjNew;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !~pObj->Value )
            continue;
        pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( pObjNew->fMark0 )
            pObj->Value = ~0;
    }
}